

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_Query_R_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Data_Query_R_PDU::Decode(Data_Query_R_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT32 *T;
  KUINT32 *T_00;
  Data_Query_PDU *pDVar1;
  KUINT16 KVar2;
  KException *this_00;
  int iVar3;
  undefined7 in_register_00000011;
  KUINT16 i_1;
  KUINT16 i;
  ushort uVar4;
  allocator<char> local_59;
  Data_Query_R_PDU *local_58;
  KUINT32 tmp;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  iVar3 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar3 = 0;
  }
  if (0x2b < iVar3 + (uint)KVar2) {
    Simulation_Management_Header::Decode((Simulation_Management_Header *)this,stream,ignoreHeader);
    Reliability_Header::Decode(&this->super_Reliability_Header,stream);
    KDataStream::Read<unsigned_int>(stream,&(this->super_Data_Query_PDU).m_ui32RequestID);
    (*(this->super_Data_Query_PDU).m_TimeInterval.super_DataTypeBase._vptr_DataTypeBase[3])
              (&(this->super_Data_Query_PDU).m_TimeInterval,stream);
    T = &(this->super_Data_Query_PDU).m_ui32NumFixedDatum;
    KDataStream::Read<unsigned_int>(stream,T);
    T_00 = &(this->super_Data_Query_PDU).m_ui32NumVariableDatum;
    KDataStream::Read<unsigned_int>(stream,T_00);
    tmp = 0;
    local_58 = this;
    for (uVar4 = 0; (uint)uVar4 < *T; uVar4 = uVar4 + 1) {
      KDataStream::Read<unsigned_int>(stream,&tmp);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&(this->super_Data_Query_PDU).m_vFixedDatum,&tmp);
    }
    pDVar1 = &local_58->super_Data_Query_PDU;
    for (uVar4 = 0; (uint)uVar4 < *T_00; uVar4 = uVar4 + 1) {
      KDataStream::Read<unsigned_int>(stream,&tmp);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&pDVar1->m_vVariableDatum,&tmp);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tmp,"Decode",&local_59);
  KException::KException(this_00,(KString *)&tmp,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Data_Query_R_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < DATA_QUERY_R_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Simulation_Management_Header::Decode( stream, ignoreHeader );
    Reliability_Header::Decode( stream );

    stream >> m_ui32RequestID
           >> KDIS_STREAM m_TimeInterval
           >> m_ui32NumFixedDatum
           >> m_ui32NumVariableDatum;

    KUINT32 tmp = 0;

    // FixedDatum
    for( KUINT16 i = 0; i < m_ui32NumFixedDatum; ++i )
    {
        stream >> tmp;
        m_vFixedDatum.push_back( tmp );
    }

    // VariableDatum
    for( KUINT16 i = 0; i < m_ui32NumVariableDatum; ++i )
    {
        stream >> tmp;
        m_vVariableDatum.push_back( tmp );
    }
}